

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

ostream * tcu::operator<<(ostream *str,ConstPixelBufferAccess *access)

{
  int iVar1;
  ostream *poVar2;
  TextureFormat *pTVar3;
  ConstPixelBufferAccess *access_local;
  ostream *str_local;
  
  poVar2 = std::operator<<(str,"format = (");
  pTVar3 = ConstPixelBufferAccess::getFormat(access);
  poVar2 = operator<<(poVar2,*pTVar3);
  poVar2 = std::operator<<(poVar2,"), size = ");
  iVar1 = ConstPixelBufferAccess::getWidth(access);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," x ");
  iVar1 = ConstPixelBufferAccess::getHeight(access);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," x ");
  iVar1 = ConstPixelBufferAccess::getDepth(access);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", pitch = ");
  iVar1 = ConstPixelBufferAccess::getRowPitch(access);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," / ");
  iVar1 = ConstPixelBufferAccess::getSlicePitch(access);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConstPixelBufferAccess& access)
{
	return str << "format = (" << access.getFormat() << "), size = "
			   << access.getWidth() << " x " << access.getHeight() << " x " << access.getDepth()
			   << ", pitch = " << access.getRowPitch() << " / " << access.getSlicePitch();
}